

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::CombinedUniformComponentsCase::iterate
          (CombinedUniformComponentsCase *this)

{
  GLenum target;
  bool bVar1;
  deBool dVar2;
  ContextType ctxType;
  int iVar3;
  RenderContext *pRVar4;
  NotSupportedError *this_00;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *this_01;
  int *piVar6;
  Enum<int,_2UL> EVar7;
  GLenum local_508;
  GLenum local_504;
  GLenum local_500;
  GLenum local_4fc;
  GLenum local_4f8;
  GLenum local_4f4;
  GetNameFunc local_4b8;
  int local_4b0;
  string local_4a8;
  allocator<char> local_481;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  GLenum local_400;
  undefined1 local_3fc [4];
  deUint32 err_2;
  StateQueryMemoryWriteGuard<int> maxUniformComponents;
  GetNameFunc local_3e0;
  int local_3d8;
  string local_3d0;
  allocator<char> local_3a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  GLenum local_328;
  undefined1 local_324 [4];
  deUint32 err_1;
  StateQueryMemoryWriteGuard<int> maxUniformBlockSize;
  GetNameFunc local_308;
  int local_300;
  string local_2f8;
  allocator<char> local_2d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  GLenum local_250;
  undefined1 local_24c [4];
  deUint32 err;
  StateQueryMemoryWriteGuard<int> maxUniformBlocks;
  GLenum maxUniformComponentsEnum;
  GLenum maxUniformBlocksEnum;
  undefined1 local_90 [8];
  ResultCollector result;
  CallLogWrapper gl;
  CombinedUniformComponentsCase *this_local;
  
  while (dVar2 = ::deGetFalse(), dVar2 == 0) {
    pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    ctxType.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
    bVar1 = glu::contextSupports(ctxType,(ApiType)(this->m_minimumVersion).m_bits);
    if (!bVar1) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      iVar3 = (*pRVar4->_vptr_RenderContext[3])();
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::CallLogWrapper::CallLogWrapper
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
                 (Functions *)CONCAT44(extraout_var,iVar3),pTVar5);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&maxUniformBlocksEnum," // ERROR: ",
                 (allocator<char> *)((long)&maxUniformComponentsEnum + 3));
      tcu::ResultCollector::ResultCollector
                ((ResultCollector *)local_90,pTVar5,(string *)&maxUniformBlocksEnum);
      std::__cxx11::string::~string((string *)&maxUniformBlocksEnum);
      std::allocator<char>::~allocator((allocator<char> *)((long)&maxUniformComponentsEnum + 3));
      if (this->m_target == 0x8266) {
        local_4f4 = 0x91bb;
      }
      else {
        if (this->m_target == 0x8e1e) {
          local_4f8 = 0x8e89;
        }
        else {
          if (this->m_target == 0x8e1f) {
            local_4fc = 0x8e8a;
          }
          else {
            local_4fc = 0xffffffff;
            if (this->m_target == 0x8a32) {
              local_4fc = 0x8a2c;
            }
          }
          local_4f8 = local_4fc;
        }
        local_4f4 = local_4f8;
      }
      if (this->m_target == 0x8266) {
        local_500 = 0x8263;
      }
      else {
        if (this->m_target == 0x8e1e) {
          local_504 = 0x8e7f;
        }
        else {
          if (this->m_target == 0x8e1f) {
            local_508 = 0x8e80;
          }
          else {
            local_508 = 0xffffffff;
            if (this->m_target == 0x8a32) {
              local_508 = 0x8ddf;
            }
          }
          local_504 = local_508;
        }
        local_500 = local_504;
      }
      glu::CallLogWrapper::enableLogging
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&maxUniformBlocks.m_value,pTVar5,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      this_01 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&maxUniformBlocks.m_value,
                           (char (*) [153])
                           "The minimum value of MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS is MAX_COMPUTE_UNIFORM_BLOCKS x MAX_UNIFORM_BLOCK_SIZE / 4 + MAX_COMPUTE_UNIFORM_COMPONENTS"
                          );
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&maxUniformBlocks.m_value);
      deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
                ((StateQueryMemoryWriteGuard<int> *)local_24c);
      piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                         ((StateQueryMemoryWriteGuard<int> *)local_24c);
      glu::CallLogWrapper::glGetIntegerv
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),local_4f4,piVar6);
      do {
        local_250 = glu::CallLogWrapper::glGetError
                              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
        if (local_250 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,"Got Error ",&local_2d1);
          EVar7 = glu::getErrorStr(local_250);
          maxUniformBlockSize._4_8_ = EVar7.m_getName;
          local_300 = EVar7.m_value;
          local_308 = (GetNameFunc)maxUniformBlockSize._4_8_;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2f8,&local_308);
          std::operator+(&local_2b0,&local_2d0,&local_2f8);
          std::operator+(&local_290,&local_2b0,": ");
          std::operator+(&local_270,&local_290,"glGetIntegerv");
          tcu::ResultCollector::fail((ResultCollector *)local_90,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::allocator<char>::~allocator(&local_2d1);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
                ((StateQueryMemoryWriteGuard<int> *)local_324);
      piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                         ((StateQueryMemoryWriteGuard<int> *)local_324);
      glu::CallLogWrapper::glGetIntegerv
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8a30,piVar6);
      do {
        local_328 = glu::CallLogWrapper::glGetError
                              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
        if (local_328 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a8,"Got Error ",&local_3a9);
          EVar7 = glu::getErrorStr(local_328);
          maxUniformComponents._4_8_ = EVar7.m_getName;
          local_3d8 = EVar7.m_value;
          local_3e0 = (GetNameFunc)maxUniformComponents._4_8_;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_3d0,&local_3e0);
          std::operator+(&local_388,&local_3a8,&local_3d0);
          std::operator+(&local_368,&local_388,": ");
          std::operator+(&local_348,&local_368,"glGetIntegerv");
          tcu::ResultCollector::fail((ResultCollector *)local_90,&local_348);
          std::__cxx11::string::~string((string *)&local_348);
          std::__cxx11::string::~string((string *)&local_368);
          std::__cxx11::string::~string((string *)&local_388);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::allocator<char>::~allocator(&local_3a9);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
                ((StateQueryMemoryWriteGuard<int> *)local_3fc);
      piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                         ((StateQueryMemoryWriteGuard<int> *)local_3fc);
      glu::CallLogWrapper::glGetIntegerv
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),local_500,piVar6);
      do {
        local_400 = glu::CallLogWrapper::glGetError
                              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
        if (local_400 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_480,"Got Error ",&local_481);
          EVar7 = glu::getErrorStr(local_400);
          local_4b8 = EVar7.m_getName;
          local_4b0 = EVar7.m_value;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_4a8,&local_4b8);
          std::operator+(&local_460,&local_480,&local_4a8);
          std::operator+(&local_440,&local_460,": ");
          std::operator+(&local_420,&local_440,"glGetIntegerv");
          tcu::ResultCollector::fail((ResultCollector *)local_90,&local_420);
          std::__cxx11::string::~string((string *)&local_420);
          std::__cxx11::string::~string((string *)&local_440);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_4a8);
          std::__cxx11::string::~string((string *)&local_480);
          std::allocator<char>::~allocator(&local_481);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                        ((StateQueryMemoryWriteGuard<int> *)local_24c,(ResultCollector *)local_90);
      if (((bVar1) &&
          (bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                             ((StateQueryMemoryWriteGuard<int> *)local_324,
                              (ResultCollector *)local_90), bVar1)) &&
         (bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                            ((StateQueryMemoryWriteGuard<int> *)local_3fc,
                             (ResultCollector *)local_90), bVar1)) {
        target = this->m_target;
        piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                           ((StateQueryMemoryWriteGuard *)local_24c);
        iVar3 = *piVar6;
        piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                           ((StateQueryMemoryWriteGuard *)local_324);
        iVar3 = iVar3 * *piVar6;
        if (iVar3 < 0) {
          iVar3 = iVar3 + 3;
        }
        piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                           ((StateQueryMemoryWriteGuard *)local_3fc);
        deqp::gls::StateQueryUtil::verifyStateIntegerMin
                  ((ResultCollector *)local_90,
                   (CallLogWrapper *)((long)&result.m_message.field_2 + 8),target,
                   (iVar3 >> 2) + *piVar6,this->m_verifierType);
      }
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_90,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_90);
      glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
      return STOP;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Test not supported in this context.",
             "contextSupports(m_context.getRenderContext().getType(), m_minimumVersion)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIntegerStateQueryTests.cpp"
             ,0x1ff);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

CombinedUniformComponentsCase::IterateResult CombinedUniformComponentsCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(m_context.getRenderContext().getType(), m_minimumVersion), "Test not supported in this context.");

	glu::CallLogWrapper		gl							(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result						(m_testCtx.getLog(), " // ERROR: ");

	const glw::GLenum		maxUniformBlocksEnum		= (m_target == GL_MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS) ? GL_MAX_COMPUTE_UNIFORM_BLOCKS
														: (m_target == GL_MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS) ? GL_MAX_TESS_CONTROL_UNIFORM_BLOCKS
														: (m_target == GL_MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS) ? GL_MAX_TESS_EVALUATION_UNIFORM_BLOCKS
														: (m_target == GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS) ? GL_MAX_GEOMETRY_UNIFORM_BLOCKS
														: -1;

	const glw::GLenum		maxUniformComponentsEnum	= (m_target == GL_MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS) ? GL_MAX_COMPUTE_UNIFORM_COMPONENTS
														: (m_target == GL_MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS) ? GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS
														: (m_target == GL_MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS) ? GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS
														: (m_target == GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS) ? GL_MAX_GEOMETRY_UNIFORM_COMPONENTS
														: -1;

	gl.enableLogging(true);

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "The minimum value of MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS is MAX_COMPUTE_UNIFORM_BLOCKS x MAX_UNIFORM_BLOCK_SIZE / 4 + MAX_COMPUTE_UNIFORM_COMPONENTS"
						<< tcu::TestLog::EndMessage;

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlocks;
	gl.glGetIntegerv(maxUniformBlocksEnum, &maxUniformBlocks);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlockSize;
	gl.glGetIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &maxUniformBlockSize);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformComponents;
	gl.glGetIntegerv(maxUniformComponentsEnum, &maxUniformComponents);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	if (maxUniformBlocks.verifyValidity(result) && maxUniformBlockSize.verifyValidity(result) && maxUniformComponents.verifyValidity(result))
		verifyStateIntegerMin(result, gl, m_target, ((int)maxUniformBlocks) * ((int)maxUniformBlockSize) / 4 + (int)maxUniformComponents, m_verifierType);

	result.setTestContextResult(m_testCtx);
	return STOP;
}